

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int32_t intersect_vector16_cardinality(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 in_XMM0_Da;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  
  uVar3 = s_a & 0xfffffffffffffff8;
  uVar9 = s_b & 0xfffffffffffffff8;
  if (uVar3 == 0 || uVar9 == 0) {
    iVar4 = 0;
    uVar6 = 0;
    uVar8 = 0;
  }
  else {
    auVar1 = vlddqu_avx(*(undefined1 (*) [16])A);
    auVar10 = ZEXT1664(auVar1);
    auVar1 = vlddqu_avx(*(undefined1 (*) [16])B);
    auVar11 = ZEXT1664(auVar1);
    uVar5 = 0;
    uVar7 = 0;
    iVar4 = 0;
    while ((uVar6 = uVar5, A[uVar7] == 0 || (B[uVar5] == 0))) {
      vpcmpestrm_avx(auVar11._0_16_,auVar10._0_16_,1);
      iVar4 = iVar4 + POPCOUNT(in_XMM0_Da);
      lVar2 = uVar7 + 7;
      if (A[lVar2] <= B[uVar5 + 7]) {
        uVar7 = uVar7 + 8;
        uVar8 = uVar3;
        if (uVar7 == uVar3) goto LAB_0010151c;
        auVar1 = vlddqu_avx(*(undefined1 (*) [16])(A + uVar7));
        auVar10 = ZEXT1664(auVar1);
      }
      if (B[uVar5 + 7] <= A[lVar2]) {
        uVar5 = uVar5 + 8;
        uVar6 = uVar9;
        uVar8 = uVar7;
        if (uVar5 == uVar9) goto LAB_0010151c;
        auVar1 = vlddqu_avx(*(undefined1 (*) [16])(B + uVar5));
        auVar11 = ZEXT1664(auVar1);
      }
    }
    uVar8 = uVar7;
    if (uVar5 < uVar9 && uVar7 < uVar3) {
      while( true ) {
        do {
          vpcmpistrm_avx(auVar11._0_16_,auVar10._0_16_,1);
          iVar4 = POPCOUNT(in_XMM0_Da) + iVar4;
          lVar2 = uVar7 + 7;
          if (A[lVar2] <= B[uVar5 + 7]) {
            uVar7 = uVar7 + 8;
            uVar6 = uVar5;
            uVar8 = uVar3;
            if (uVar7 == uVar3) goto LAB_0010151c;
            auVar1 = vlddqu_avx(*(undefined1 (*) [16])(A + uVar7));
            auVar10 = ZEXT1664(auVar1);
          }
        } while (A[lVar2] < B[uVar5 + 7]);
        uVar5 = uVar5 + 8;
        uVar6 = uVar9;
        uVar8 = uVar7;
        if (uVar5 == uVar9) break;
        auVar1 = vlddqu_avx(*(undefined1 (*) [16])(B + uVar5));
        auVar11 = ZEXT1664(auVar1);
      }
    }
  }
LAB_0010151c:
  while ((uVar8 < s_a && (uVar6 < s_b))) {
    if (A[uVar8] < B[uVar6]) {
      uVar8 = uVar8 + 1;
    }
    else {
      if (A[uVar8] <= B[uVar6]) {
        iVar4 = iVar4 + 1;
        uVar8 = uVar8 + 1;
      }
      uVar6 = uVar6 + 1;
    }
  }
  return iVar4;
}

Assistant:

int32_t intersect_vector16_cardinality(const uint16_t *__restrict__ A,
                                       size_t s_a,
                                       const uint16_t *__restrict__ B,
                                       size_t s_b) {
    size_t count = 0;
    size_t i_a = 0, i_b = 0;
    const int vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    __m128i v_a, v_b;
    if ((i_a < st_a) && (i_b < st_b)) {
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        while ((A[i_a] == 0) || (B[i_b] == 0)) {
            const __m128i res_v = _mm_cmpestrm(
                v_b, vectorlength, v_a, vectorlength,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            const int r = _mm_extract_epi32(res_v, 0);
            count += _mm_popcnt_u32(r);
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                i_a += vectorlength;
                if (i_a == st_a) break;
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        if ((i_a < st_a) && (i_b < st_b))
            while (true) {
                const __m128i res_v = _mm_cmpistrm(
                    v_b, v_a,
                    _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
                const int r = _mm_extract_epi32(res_v, 0);
                count += _mm_popcnt_u32(r);
                const uint16_t a_max = A[i_a + vectorlength - 1];
                const uint16_t b_max = B[i_b + vectorlength - 1];
                if (a_max <= b_max) {
                    i_a += vectorlength;
                    if (i_a == st_a) break;
                    v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
                }
                if (b_max <= a_max) {
                    i_b += vectorlength;
                    if (i_b == st_b) break;
                    v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
                }
            }
    }
    // intersect the tail using scalar intersection
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (a < b) {
            i_a++;
        } else if (b < a) {
            i_b++;
        } else {
            count++;
            i_a++;
            i_b++;
        }
    }
    return (int32_t)count;
}